

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O2

void discrete_dist_test<trng::discrete_dist>(discrete_dist *d)

{
  bool bVar1;
  allocator local_131;
  SourceLineInfo local_130;
  string local_120;
  SectionInfo local_100;
  Section local_b0;
  
  local_130.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_130.line = 0x12d;
  std::__cxx11::string::string((string *)&local_120,"test pdf & cdf",&local_131);
  Catch::SectionInfo::SectionInfo(&local_100,&local_130,&local_120);
  Catch::Section::Section(&local_b0,&local_100);
  Catch::SectionInfo::~SectionInfo(&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  bVar1 = Catch::Section::operator_cast_to_bool(&local_b0);
  if (bVar1) {
    discrete_dist_test_pdf<trng::discrete_dist>(d);
  }
  Catch::Section::~Section(&local_b0);
  local_130.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_130.line = 0x130;
  std::__cxx11::string::string((string *)&local_120,"chi2_test",&local_131);
  Catch::SectionInfo::SectionInfo(&local_100,&local_130,&local_120);
  Catch::Section::Section(&local_b0,&local_100);
  Catch::SectionInfo::~SectionInfo(&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  bVar1 = Catch::Section::operator_cast_to_bool(&local_b0);
  if (bVar1) {
    discrete_dist_test_chi2_test<trng::discrete_dist>(d);
  }
  Catch::Section::~Section(&local_b0);
  local_130.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_130.line = 0x133;
  std::__cxx11::string::string((string *)&local_120,"streamable",&local_131);
  Catch::SectionInfo::SectionInfo(&local_100,&local_130,&local_120);
  Catch::Section::Section(&local_b0,&local_100);
  Catch::SectionInfo::~SectionInfo(&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  bVar1 = Catch::Section::operator_cast_to_bool(&local_b0);
  if (bVar1) {
    discrete_dist_test_streamable<trng::discrete_dist>(d);
  }
  Catch::Section::~Section(&local_b0);
  return;
}

Assistant:

void discrete_dist_test(T &d) {
  SECTION("test pdf & cdf") {
    discrete_dist_test_pdf(d);
  }
  SECTION("chi2_test") {
    discrete_dist_test_chi2_test(d);
  }
  SECTION("streamable") {
    discrete_dist_test_streamable(d);
  }
}